

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O0

void __thiscall Solution::createNursesAndTurns(Solution *this)

{
  bool bVar1;
  Scenario *pSVar2;
  vector<Nurse,_std::allocator<Nurse>_> *this_00;
  NurseSolution *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *this_02;
  reference __p;
  ShiftType *this_03;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  reference pbVar5;
  Turn *this_04;
  Turn *local_170;
  Turn *turn;
  string skill;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  ShiftType *local_128;
  ShiftType *shiftType;
  ShiftType **local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
  *shift;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *__range2;
  vector<Turn_*,_std::allocator<Turn_*>_> shifts;
  int j;
  NurseSolution *local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
  local_58;
  reference local_30;
  Nurse *sce_nurses;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Nurse,_std::allocator<Nurse>_> *__range1;
  Solution *this_local;
  
  pSVar2 = Scenario::getInstance();
  this_00 = Scenario::getNurses(pSVar2);
  __end1 = std::vector<Nurse,_std::allocator<Nurse>_>::begin(this_00);
  sce_nurses = (Nurse *)std::vector<Nurse,_std::allocator<Nurse>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Nurse_*,_std::vector<Nurse,_std::allocator<Nurse>_>_>
                                *)&sce_nurses);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_Nurse_*,_std::vector<Nurse,_std::allocator<Nurse>_>_>::
               operator*(&__end1);
    psVar3 = Nurse::getId_abi_cxx11_(local_30);
    this_01 = (NurseSolution *)operator_new(0x20);
    NurseSolution::NurseSolution(this_01,local_30);
    local_60 = this_01;
    std::make_pair<std::__cxx11::string_const&,NurseSolution*>(&local_58,psVar3,&local_60);
    std::
    map<std::__cxx11::string,NurseSolution*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NurseSolution*>>>
    ::insert<std::pair<std::__cxx11::string,NurseSolution*>>
              ((map<std::__cxx11::string,NurseSolution*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NurseSolution*>>>
                *)&this->nurses,&local_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
    ::~pair(&local_58);
    __gnu_cxx::__normal_iterator<const_Nurse_*,_std::vector<Nurse,_std::allocator<Nurse>_>_>::
    operator++(&__end1);
  }
  for (shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 7;
      shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
    pSVar2 = Scenario::getInstance();
    this_02 = Scenario::getShifts_abi_cxx11_(pSVar2);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
             ::begin(this_02);
    shift = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
               ::end(this_02);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&shift);
      if (!bVar1) break;
      __p = std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>
            ::operator*(&__end2);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
                  *)&shiftType,__p);
      local_c0 = &shiftType;
      this_03 = (ShiftType *)operator_new(0x40);
      psVar3 = ShiftType::getId_abi_cxx11_((ShiftType *)(local_c0 + 4));
      __range3._4_4_ =
           ShiftType::getMinimumNumberOfConsecutiveAssignments((ShiftType *)(local_c0 + 4));
      __range3._0_4_ =
           ShiftType::getMaximumNumberOfConsecutiveAssignments((ShiftType *)(local_c0 + 4));
      ShiftType::ShiftType(this_03,psVar3,(int *)((long)&__range3 + 4),(int *)&__range3);
      local_128 = this_03;
      pvVar4 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_((ShiftType *)(local_c0 + 4));
      ShiftType::setForbidden(this_03,pvVar4);
      pSVar2 = Scenario::getInstance();
      pvVar4 = Scenario::getSkills_abi_cxx11_(pSVar2);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar4);
      skill.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(pvVar4);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&skill.field_2 + 8));
        if (!bVar1) break;
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        std::__cxx11::string::string((string *)&turn,(string *)pbVar5);
        this_04 = (Turn *)operator_new(0x50);
        Turn::Turn(this_04,shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,(string *)&turn,local_128
                  );
        local_170 = this_04;
        std::vector<Turn_*,_std::allocator<Turn_*>_>::push_back
                  ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2,&local_170);
        std::__cxx11::string::~string((string *)&turn);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
               *)&shiftType);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
    ::push_back(&this->turns,(value_type *)&__range2);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::~vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)&__range2);
  }
  return;
}

Assistant:

void Solution::createNursesAndTurns() {
    //create list of nurses with solution
    for (const Nurse &sce_nurses : Scenario::getInstance()->getNurses())
        nurses.insert(make_pair(sce_nurses.getId(),new NurseSolution(&sce_nurses)));

    using req_map = unordered_map<string, unordered_map<ShiftType*, vector<DayRequirement*>>>;

    //hardcoded size of week
    for(int j = 0; j < 7; j++) {
        vector<Turn *> shifts;

        for (pair<string,ShiftType> const &shift :  Scenario::getInstance()->getShifts()) {
            ShiftType* shiftType = new ShiftType(shift.second.getId(),shift.second.getMinimumNumberOfConsecutiveAssignments(),shift.second.getMaximumNumberOfConsecutiveAssignments());
            shiftType->setForbidden(shift.second.getForbiddenSucceedingShiftTypes());
            for(string skill : Scenario::getInstance()->getSkills()) {
                Turn *turn = new Turn(j, skill, shiftType);
                shifts.push_back(turn);
            }
        }
        turns.push_back(shifts);
    }
}